

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

size_t __thiscall
robin_hood::detail::
Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::findIdx<std::__cxx11::string>
          (Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  byte *pbVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  pointer __s1;
  size_t __n;
  undefined8 *puVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  size_t sVar10;
  uint uVar11;
  uint uVar12;
  
  sVar8 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)this,key);
  uVar9 = sVar8 * *(long *)(this + 0x10) >> 0x21 ^ sVar8 * *(long *)(this + 0x10);
  iVar2 = *(int *)(this + 0x40);
  uVar11 = ((uint)uVar9 & 0x1f) >> ((ulong)(byte)this[0x44] & 0x3f);
  uVar12 = iVar2 + uVar11;
  uVar3 = *(ulong *)(this + 0x30);
  sVar10 = uVar9 >> 5 & uVar3;
  lVar4 = *(long *)(this + 0x18);
  lVar5 = *(long *)(this + 0x20);
  __s1 = (key->_M_dataplus)._M_p;
  __n = key->_M_string_length;
  sVar8 = sVar10 + 1;
  uVar11 = uVar11 + iVar2 * 2;
  do {
    if ((uVar12 == *(byte *)(lVar5 + -1 + sVar8)) &&
       (puVar6 = *(undefined8 **)(lVar4 + -8 + sVar8 * 8), __n == puVar6[1])) {
      if (__n == 0) {
        return sVar8 - 1;
      }
      iVar7 = bcmp(__s1,(void *)*puVar6,__n);
      if (iVar7 == 0) {
        return sVar10;
      }
    }
    if ((uVar11 == *(byte *)(lVar5 + sVar8)) &&
       (puVar6 = *(undefined8 **)(lVar4 + sVar8 * 8), __n == puVar6[1])) {
      if (__n == 0) {
        return sVar10 + 1;
      }
      iVar7 = bcmp(__s1,(void *)*puVar6,__n);
      if (iVar7 == 0) {
        return sVar8;
      }
    }
    uVar12 = uVar12 + iVar2 * 2;
    sVar10 = sVar10 + 2;
    pbVar1 = (byte *)(lVar5 + 1 + sVar8);
    sVar8 = sVar8 + 2;
    uVar11 = uVar11 + iVar2 * 2;
    if (*pbVar1 < uVar12) {
      if (uVar3 == 0) {
        sVar8 = 0;
      }
      else {
        sVar8 = lVar5 - *(long *)(this + 0x18) >> 3;
      }
      return sVar8;
    }
  } while( true );
}

Assistant:

size_t findIdx(Other const& key) const {
        size_t idx{};
        InfoType info{};
        keyToIdx(key, &idx, &info);

        do {
            // unrolling this twice gives a bit of a speedup. More unrolling did not help.
            if (info == mInfo[idx] &&
                ROBIN_HOOD_LIKELY(WKeyEqual::operator()(key, mKeyVals[idx].getFirst()))) {
                return idx;
            }
            next(&info, &idx);
            if (info == mInfo[idx] &&
                ROBIN_HOOD_LIKELY(WKeyEqual::operator()(key, mKeyVals[idx].getFirst()))) {
                return idx;
            }
            next(&info, &idx);
        } while (info <= mInfo[idx]);

        // nothing found!
        return mMask == 0 ? 0
                          : static_cast<size_t>(std::distance(
                                mKeyVals, reinterpret_cast_no_cast_align_warning<Node*>(mInfo)));
    }